

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixAccess(sqlite3_vfs *NotUsed,char *zPath,int flags,int *pResOut)

{
  int iVar1;
  uint *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  stat buf;
  bool local_ba;
  bool local_b9;
  undefined1 local_98 [24];
  uint local_80;
  long local_68;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0) {
    memset(local_98,0xaa,0x90);
    iVar1 = (*aSyscall[4].pCurrent)(in_RSI,local_98);
    local_b9 = false;
    if (iVar1 == 0) {
      local_ba = (local_80 & 0xf000) != 0x8000 || 0 < local_68;
      local_b9 = local_ba;
    }
    *in_RCX = (uint)local_b9;
  }
  else {
    iVar1 = (*aSyscall[2].pCurrent)(in_RSI,6);
    *in_RCX = (uint)(iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int unixAccess(
  sqlite3_vfs *NotUsed,   /* The VFS containing this xAccess method */
  const char *zPath,      /* Path of the file to examine */
  int flags,              /* What do we want to learn about the zPath file? */
  int *pResOut            /* Write result boolean here */
){
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError( return SQLITE_IOERR_ACCESS; );
  assert( pResOut!=0 );

  /* The spec says there are three possible values for flags.  But only
  ** two of them are actually used */
  assert( flags==SQLITE_ACCESS_EXISTS || flags==SQLITE_ACCESS_READWRITE );

  if( flags==SQLITE_ACCESS_EXISTS ){
    struct stat buf;
    *pResOut = 0==osStat(zPath, &buf) &&
                (!S_ISREG(buf.st_mode) || buf.st_size>0);
  }else{
    *pResOut = osAccess(zPath, W_OK|R_OK)==0;
  }
  return SQLITE_OK;
}